

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O2

void prvTidyPPrintXMLTree(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  Node *pNVar1;
  Node *node_00;
  Bool BVar2;
  Node **ppNVar3;
  Node *node_01;
  uint indent_00;
  uint extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  Node **ppNVar5;
  int iVar6;
  uint indent_01;
  bool bVar7;
  undefined8 uVar4;
  
  if (node != (Node *)0x0) {
    iVar6 = *(int *)((doc->config).value + 0x61);
    if (doc->progressCallback != (TidyPPProgress)0x0) {
      (*doc->progressCallback)((TidyDoc)doc,node->line,node->column,(doc->pprint).line + 1);
    }
    switch(node->type) {
    case RootNode:
      ppNVar5 = &node->content;
      while (pNVar1 = *ppNVar5, pNVar1 != (Node *)0x0) {
        prvTidyPPrintXMLTree(doc,mode,indent,pNVar1);
        ppNVar5 = &pNVar1->next;
      }
      break;
    case DocTypeTag:
      PPrintDocType(doc,indent,node);
      return;
    case CommentTag:
      PCondFlushLineSmart(doc,indent);
      PPrintComment(doc,indent,node);
      return;
    case ProcInsTag:
      PPrintPI(doc,indent,node);
      return;
    case TextNode:
      PPrintText(doc,mode,indent,node);
      return;
    default:
      BVar2 = prvTidynodeHasCM(node,1);
      if ((BVar2 != no) || ((node->type == StartEndTag && (iVar6 == 0)))) {
        PCondFlushLineSmart(doc,indent);
        PPrintTag(doc,mode,indent,node);
        return;
      }
      iVar6 = *(int *)((doc->config).value + 0x26);
      ppNVar5 = &node->content;
      ppNVar3 = ppNVar5;
      do {
        pNVar1 = *ppNVar3;
        if (pNVar1 == (Node *)0x0) goto LAB_001497ed;
        BVar2 = prvTidynodeIsText(pNVar1);
        ppNVar3 = &pNVar1->next;
      } while (BVar2 == no);
      iVar6 = 0;
LAB_001497ed:
      PCondFlushLineSmart(doc,indent);
      BVar2 = prvTidyXMLPreserveWhiteSpace(doc,node);
      indent_01 = iVar6 + indent;
      bVar7 = BVar2 != no;
      if (bVar7) {
        indent = 0;
        indent_01 = 0;
      }
      node_01 = node;
      PPrintTag(doc,mode,indent,node);
      uVar4 = extraout_RDX;
      ppNVar3 = ppNVar5;
      if ((bVar7 || pNVar1 == (Node *)0x0) && (*ppNVar5 != (Node *)0x0)) {
        prvTidyPFlushLineSmart(doc,indent_01);
        uVar4 = extraout_RDX_00;
      }
      while( true ) {
        indent_00 = (uint)uVar4;
        node_00 = *ppNVar3;
        if (node_00 == (Node *)0x0) break;
        node_01 = node_00;
        prvTidyPPrintXMLTree(doc,mode,indent_01,node_00);
        uVar4 = extraout_RDX_01;
        ppNVar3 = &node_00->next;
      }
      if ((bVar7 || pNVar1 == (Node *)0x0) && (*ppNVar5 != (Node *)0x0)) {
        PCondFlushLineSmart(doc,indent);
        indent_00 = extraout_EDX;
      }
      PPrintEndTag(doc,(uint)node,indent_00,node_01);
      return;
    case CDATATag:
      PPrintCDATA(doc,indent,node);
      return;
    case SectionTag:
      PPrintSection(doc,indent,node);
      return;
    case AspTag:
      PPrintAsp(doc,indent,node);
      return;
    case JsteTag:
      PPrintJste(doc,indent,node);
      return;
    case PhpTag:
      PPrintPhp(doc,indent,node);
      return;
    case XmlDecl:
      PPrintXmlDecl(doc,indent,node);
      return;
    }
  }
  return;
}

Assistant:

void TY_(PPrintXMLTree)( TidyDocImpl* doc, uint mode, uint indent, Node *node )
{
    Bool xhtmlOut = cfgBool( doc, TidyXhtmlOut );
    if (node == NULL)
        return;

    if (doc->progressCallback)
    {
        doc->progressCallback( tidyImplToDoc(doc), node->line, node->column, doc->pprint.line + 1 );
    }
    
    if ( node->type == TextNode)
    {
        PPrintText( doc, mode, indent, node );
    }
    else if ( node->type == CommentTag )
    {
        PCondFlushLineSmart( doc, indent );
        PPrintComment( doc, indent, node);
        /* PCondFlushLine( doc, 0 ); */
    }
    else if ( node->type == RootNode )
    {
        Node *content;
        for ( content = node->content;
              content != NULL;
              content = content->next )
           TY_(PPrintXMLTree)( doc, mode, indent, content );
    }
    else if ( node->type == DocTypeTag )
        PPrintDocType( doc, indent, node );
    else if ( node->type == ProcInsTag )
        PPrintPI( doc, indent, node );
    else if ( node->type == XmlDecl )
        PPrintXmlDecl( doc, indent, node );
    else if ( node->type == CDATATag )
        PPrintCDATA( doc, indent, node );
    else if ( node->type == SectionTag )
        PPrintSection( doc, indent, node );
    else if ( node->type == AspTag )
        PPrintAsp( doc, indent, node );
    else if ( node->type == JsteTag)
        PPrintJste( doc, indent, node );
    else if ( node->type == PhpTag)
        PPrintPhp( doc, indent, node );
    else if ( TY_(nodeHasCM)(node, CM_EMPTY) ||
              (node->type == StartEndTag && !xhtmlOut) )
    {
        PCondFlushLineSmart( doc, indent );
        PPrintTag( doc, mode, indent, node );
        /* TY_(PFlushLine)( doc, indent ); */
    }
    else /* some kind of container element */
    {
        uint spaces = cfg( doc, TidyIndentSpaces );
        Node *content;
        Bool mixed = no;
        uint cindent;

        for ( content = node->content; content; content = content->next )
        {
            if ( TY_(nodeIsText)(content) )
            {
                mixed = yes;
                break;
            }
        }

        PCondFlushLineSmart( doc, indent );

        if ( TY_(XMLPreserveWhiteSpace)(doc, node) )
        {
            indent = 0;
            mixed = no;
            cindent = 0;
        }
        else if (mixed)
            cindent = indent;
        else
            cindent = indent + spaces;

        PPrintTag( doc, mode, indent, node );
        if ( !mixed && node->content )
            TY_(PFlushLineSmart)( doc, cindent );
 
        for ( content = node->content; content; content = content->next )
            TY_(PPrintXMLTree)( doc, mode, cindent, content );

        if ( !mixed && node->content )
            PCondFlushLineSmart( doc, indent );

        PPrintEndTag( doc, mode, indent, node );
        /* PCondFlushLine( doc, indent ); */
    }
}